

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

ptrdiff_t mp_check_extl(char *cur,char *end)

{
  byte bVar1;
  uint8_t c;
  char *end_local;
  char *cur_local;
  byte local_9;
  
  end_local = cur;
  if (end <= cur) {
    __assert_fail("cur < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                  ,0x680,"ptrdiff_t mp_check_extl(const char *, const char *)");
  }
  local_9 = *cur;
  if (mp_type_hint[local_9] == MP_EXT) {
    bVar1 = mp_load_u8(&end_local);
    if ((bVar1 & 0xf0) == 0xd0) {
      cur_local = (char *)(1 - ((long)end - (long)end_local));
    }
    else {
      if ((bVar1 < 199) || (0xc9 < bVar1)) {
        __assert_fail("c >= 0xc7 && c <= 0xc9",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                      ,0x687,"ptrdiff_t mp_check_extl(const char *, const char *)");
      }
      cur_local = (char *)((long)((1 << (bVar1 + 0x39 & 0x1f)) + 1) - ((long)end - (long)end_local))
      ;
    }
    return (ptrdiff_t)cur_local;
  }
  __assert_fail("mp_typeof(*cur) == MP_EXT",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                ,0x681,"ptrdiff_t mp_check_extl(const char *, const char *)");
}

Assistant:

MP_IMPL ptrdiff_t
mp_check_extl(const char *cur, const char *end)
{
	assert(cur < end);
	assert(mp_typeof(*cur) == MP_EXT);
	uint8_t c = mp_load_u8(&cur);
	if ((c & 0xf0) == 0xd0) {
		return 1 - (end - cur);
	}

	assert(c >= 0xc7 && c <= 0xc9);
	return (1 << (c - 0xc7)) + 1 - (end - cur); /* 0xc7 -> 2, 0xc8 -> 3, 0xc9 ->5 */
}